

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::ResourceBundle::getNextString
          (UnicodeString *__return_storage_ptr__,ResourceBundle *this,char **key,UErrorCode *status)

{
  ConstChar16Ptr local_40;
  UChar *local_38;
  UChar *r;
  UErrorCode *pUStack_28;
  int32_t len;
  UErrorCode *status_local;
  char **key_local;
  ResourceBundle *this_local;
  
  r._4_4_ = 0;
  pUStack_28 = status;
  status_local = (UErrorCode *)key;
  key_local = (char **)this;
  this_local = (ResourceBundle *)__return_storage_ptr__;
  local_38 = ures_getNextString_63(this->fResource,(int32_t *)((long)&r + 4),key,status);
  ConstChar16Ptr::ConstChar16Ptr(&local_40,local_38);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',&local_40,r._4_4_);
  ConstChar16Ptr::~ConstChar16Ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString ResourceBundle::getNextString(const char ** key, UErrorCode& status) {
    int32_t len = 0;
    const UChar* r = ures_getNextString(fResource, &len, key, &status);
    return UnicodeString(TRUE, r, len);
}